

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::checkUniqueResetOrders(ValidatorImpl *this,ModelPtr *model)

{
  IssueImpl *this_00;
  _Base_ptr p_Var1;
  IssuePtr issue;
  vector<int,_std::allocator<int>_> orders;
  shared_ptr<libcellml::Variable> variable;
  set<int,_std::less<int>,_std::allocator<int>_> ordersSet;
  ResetOrderMap resetOrderMap;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  buildModelResetOrderMap(&resetOrderMap,this,model);
  for (p_Var1 = resetOrderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &resetOrderMap._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 1));
    std::vector<int,_std::allocator<int>_>::vector
              (&orders,(vector<int,_std::allocator<int>_> *)&p_Var1[1]._M_left);
    std::set<int,std::less<int>,std::allocator<int>>::
    set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((set<int,std::less<int>,std::allocator<int>> *)&ordersSet,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               orders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        orders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    if (ordersSet._M_t._M_impl.super__Rb_tree_header._M_node_count <
        (ulong)((long)orders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)orders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2)) {
      Issue::IssueImpl::create();
      Issue::IssueImpl::setReferenceRule
                ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,RESET_ORDER_UNIQUE);
      this_00 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                mPimpl;
      NamedEntity::name_abi_cxx11_
                (&local_90,
                 &(variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_NamedEntity);
      std::operator+(&local_70,"Variable \'",&local_90);
      std::operator+(&local_50,&local_70,
                     "\' used in resets does not have unique order values across the equivalent variable set."
                    );
      Issue::IssueImpl::setDescription(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      AnyCellmlElement::AnyCellmlElementImpl::setModel
                ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,model,MODEL);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&ordersSet._M_t);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&orders.super__Vector_base<int,_std::allocator<int>_>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::
  _Rb_tree<std::shared_ptr<libcellml::Variable>,_std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::shared_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::shared_ptr<libcellml::Variable>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&resetOrderMap._M_t);
  return;
}

Assistant:

void Validator::ValidatorImpl::checkUniqueResetOrders(const ModelPtr &model)
{
    auto resetOrderMap = buildModelResetOrderMap(model);
    for (const auto &variableOrder : resetOrderMap) {
        auto variable = variableOrder.first;
        auto orders = variableOrder.second;

        std::set<int> ordersSet(orders.begin(), orders.end());

        if (ordersSet.size() < orders.size()) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::RESET_ORDER_UNIQUE);
            issue->mPimpl->setDescription("Variable '" + variable->name() + "' used in resets does not have unique order values across the equivalent variable set.");
            issue->mPimpl->mItem->mPimpl->setModel(model);
            addIssue(issue);
        }
    }
}